

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemListView.cpp
# Opt level: O0

void __thiscall
QFileSystemListViewPrivate::activated(QFileSystemListViewPrivate *this,QModelIndex *index)

{
  QFlags_conflict1 *pQVar1;
  bool bVar2;
  byte bVar3;
  ulong uVar4;
  QFileSystemListView *in_RDI;
  QFileInfo fileInfo;
  QFlags<QDir::Filter> *in_stack_ffffffffffffff68;
  QFlags<QDir::Filter> *this_00;
  KeyboardModifier in_stack_ffffffffffffff70;
  QFlags<Qt::KeyboardModifier> in_stack_ffffffffffffff74;
  undefined7 in_stack_ffffffffffffff98;
  QFileInfo local_20 [12];
  undefined4 local_14;
  
  if (((in_RDI->field_0x20 & 1) != 0) &&
     (uVar4 = QFileSystemModel::isDir(*(QModelIndex **)&in_RDI->field_0x18), (uVar4 & 1) != 0)) {
    local_14 = QGuiApplication::keyboardModifiers();
    bVar2 = ::operator!=(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
    if (!bVar2) {
      QFileSystemModel::fileInfo((QModelIndex *)local_20);
      bVar3 = QFileInfo::isReadable();
      if ((bVar3 & 1) != 0) {
        QFileInfo::filePath();
        QFileSystemListView::setRootPath
                  (in_RDI,(QString *)CONCAT17(bVar3,in_stack_ffffffffffffff98));
        QString::~QString((QString *)0x2356f2);
        bVar3 = QFileInfo::isRoot();
        if (((bVar3 & 1) == 0) && ((in_RDI->field_0x20 & 1) != 0)) {
          this_00 = *(QFlags<QDir::Filter> **)&in_RDI->field_0x18;
          QFileSystemModel::filter();
          QFlags<QDir::Filter>::operator&(this_00,0);
          QFileSystemModel::setFilter((QFlags_conflict1 *)this_00);
        }
        else {
          pQVar1 = *(QFlags_conflict1 **)&in_RDI->field_0x18;
          QFileSystemModel::filter();
          QFlags<QDir::Filter>::operator|(in_stack_ffffffffffffff68,~NoFilter);
          QFileSystemModel::setFilter(pQVar1);
        }
      }
      QFileInfo::~QFileInfo(local_20);
    }
  }
  return;
}

Assistant:

void activated(const QModelIndex &index) {
        if (!browsable || !model->isDir(index) || QApplication::keyboardModifiers() != Qt::NoModifier) {
            return;
        }

        const QFileInfo fileInfo = model->fileInfo(index);
        if (fileInfo.isReadable()) {
            widget->setRootPath(fileInfo.filePath());

            if (fileInfo.isRoot() || !browsable) {
                model->setFilter(model->filter() | QDir::NoDotDot);
            } else {
                model->setFilter(model->filter() & ~QDir::NoDotDot);
            }
        }
    }